

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Namespace.h
# Opt level: O2

Namespace * __thiscall
luabridge::Namespace::addFunction<bool,char_const*,unsigned_short>
          (Namespace *this,char *name,_func_bool_char_ptr_unsigned_short *fp)

{
  int iVar1;
  
  iVar1 = lua_type((this->super_Registrar).L,-1);
  if (iVar1 == 5) {
    lua_pushlightuserdata((this->super_Registrar).L,fp);
    lua_pushcclosure((this->super_Registrar).L,
                     detail::CFunc::Call<bool_(*)(const_char_*,_unsigned_short)>::f,1);
    rawsetfield((this->super_Registrar).L,-2,name);
    return this;
  }
  __assert_fail("lua_istable(L, -1)",
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/LuaBridge/Source/LuaBridge/detail/Namespace.h"
                ,0x507,
                "Namespace &luabridge::Namespace::addFunction(const char *, ReturnType (*)(Params...)) [ReturnType = bool, Params = <const char *, unsigned short>]"
               );
}

Assistant:

Namespace& addFunction(char const* name, ReturnType (*fp)(Params...))
    {
        assert(lua_istable(L, -1)); // Stack: namespace table (ns)

        using FnType = decltype(fp);
        lua_pushlightuserdata(L, reinterpret_cast<void*>(fp)); // Stack: ns, function ptr
        lua_pushcclosure(L, &CFunc::Call<FnType>::f, 1); // Stack: ns, function
        rawsetfield(L, -2, name); // Stack: ns

        return *this;
    }